

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  undefined8 *puVar1;
  _func_int **in_RAX;
  Status SVar2;
  long in_RSI;
  long lVar3;
  long lVar4;
  Status local_38;
  
  lVar3 = -1;
  lVar4 = 0;
  local_38.state_ = (char *)in_RAX;
  do {
    lVar3 = lVar3 + 1;
    if (*(int *)(in_RSI + 0x38) <= lVar3) {
      SVar2.state_ = (char *)0x0;
      break;
    }
    puVar1 = (undefined8 *)(*(long *)(in_RSI + 0x30) + lVar4);
    lVar4 = lVar4 + 0x20;
    (**(code **)(*(long *)*puVar1 + 0x50))(&local_38);
    SVar2.state_ = local_38.state_;
    local_38.state_ = (char *)0x0;
    Status::~Status(&local_38);
  } while ((_func_int **)SVar2.state_ == (_func_int **)0x0);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)SVar2.state_;
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }